

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<sptk::int24_t,_sptk::int24_t>::Run
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  int24_t *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  uint8_t *puVar9;
  size_t *__idx;
  uint8_t *puVar10;
  uint8_t uVar11;
  ulong uVar12;
  uint8_t uVar13;
  int24_t *piVar14;
  uint8_t uVar15;
  bool bVar16;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  int24_t input_data;
  int24_t local_2aa;
  int24_t local_2a7;
  ushort local_2a4;
  allocator local_2a1;
  int24_t *local_2a0;
  int24_t *local_298;
  uint8_t *local_290;
  uint8_t *local_288;
  uint8_t *local_280;
  uint8_t *local_278;
  ulong local_270;
  int local_264;
  istream *local_260;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_298 = &this->minimum_value_;
  local_2a0 = &this->maximum_value_;
  local_288 = (this->maximum_value_).value + 1;
  local_290 = (this->maximum_value_).value + 2;
  local_278 = (this->minimum_value_).value + 1;
  local_280 = (this->minimum_value_).value + 2;
  local_258 = &this->print_format_;
  uVar12 = 0;
  local_260 = input_stream;
  do {
    input_data.value[0] = '\0';
    input_data.value[1] = '\0';
    input_data.value[2] = '\0';
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_260,(string *)&word);
      bVar16 = word._M_string_length == 0;
      if (!bVar16) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_2a4 = in_FPUControlWord | 0xc00;
        local_264 = (int)ROUND(in_ST0);
        input_data.value._0_2_ = SUB42(local_264,0);
        input_data.value[2] = (uint8_t)((uint)local_264 >> 0x10);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar16) goto LAB_0011788b;
      if (bVar16) {
        if (bVar16) {
LAB_00117b7a:
          bVar16 = true;
          if ((this->is_ascii_output_ == true) && ((int)uVar12 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00117b9d:
          bVar16 = false;
        }
        return bVar16;
      }
    }
    else {
      bVar16 = sptk::ReadStream<sptk::int24_t>(&input_data,local_260);
      if (!bVar16) goto LAB_00117b7a;
LAB_0011788b:
      uVar15 = input_data.value[2];
      uVar11 = input_data.value[0];
      uVar13 = input_data.value[1];
      local_270 = uVar12;
      iVar4 = sptk::int24_t::operator_cast_to_int(local_298);
      iVar5 = sptk::int24_t::operator_cast_to_int(local_2a0);
      if (iVar4 < iVar5) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
LAB_001178d5:
          iVar4 = sptk::int24_t::operator_cast_to_int(&input_data);
          piVar14 = local_298;
          iVar5 = sptk::int24_t::operator_cast_to_int(local_298);
          piVar3 = local_2a0;
          puVar9 = local_280;
          puVar10 = local_278;
          if (iVar5 <= iVar4) {
            iVar4 = sptk::int24_t::operator_cast_to_int(local_2a0);
            iVar5 = sptk::int24_t::operator_cast_to_int(&input_data);
            puVar9 = local_290;
            puVar10 = local_288;
            piVar14 = piVar3;
            if (iVar5 <= iVar4) goto LAB_00117a29;
          }
        }
        else {
          if (NVar1 != kUnsignedInteger) {
            if (NVar1 != kSignedInteger) goto LAB_00117a29;
            goto LAB_001178d5;
          }
          uVar6 = sptk::int24_t::operator_cast_to_int(&input_data);
          piVar14 = local_298;
          uVar7 = sptk::int24_t::operator_cast_to_int(local_298);
          piVar3 = local_2a0;
          puVar9 = local_280;
          puVar10 = local_278;
          if (uVar7 <= uVar6) {
            uVar6 = sptk::int24_t::operator_cast_to_int(local_2a0);
            uVar7 = sptk::int24_t::operator_cast_to_int(&input_data);
            puVar9 = local_290;
            puVar10 = local_288;
            piVar14 = piVar3;
            if (uVar7 <= uVar6) goto LAB_00117a29;
          }
        }
        uVar11 = piVar14->value[0];
        uVar13 = *puVar10;
        uVar15 = *puVar9;
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&word,(int)local_270);
          std::operator<<(poVar8,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_2a1);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar2 == kExit) goto LAB_00117b9d;
        }
      }
      else {
LAB_00117a29:
        if (this->rounding_ == true) {
          iVar4 = sptk::int24_t::operator_cast_to_int(&input_data);
          if (iVar4 < 1) {
            sptk::int24_t::operator-((int24_t *)&word,0.5);
          }
          else {
            sptk::int24_t::operator+((int24_t *)&word,0.5);
          }
          uVar11 = (uint8_t)word._M_dataplus._M_p;
          uVar15 = word._M_dataplus._M_p._2_1_;
          uVar13 = word._M_dataplus._M_p._1_1_;
        }
      }
      if (this->is_ascii_output_ == true) {
        local_2a7.value[0] = uVar11;
        local_2a7.value[1] = uVar13;
        local_2a7.value[2] = uVar15;
        bVar16 = sptk::SnPrintf<sptk::int24_t>(&local_2a7,local_258,0x80,buffer);
        if (!bVar16) goto LAB_00117b9d;
        std::operator<<((ostream *)&std::cout,buffer);
        if (((int)local_270 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          uVar12 = local_270;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          uVar12 = local_270;
        }
      }
      else {
        local_2aa.value[0] = uVar11;
        local_2aa.value[1] = uVar13;
        local_2aa.value[2] = uVar15;
        bVar16 = sptk::WriteStream<sptk::int24_t>(&local_2aa,(ostream *)&std::cout);
        uVar12 = local_270;
        if (!bVar16) goto LAB_00117b9d;
      }
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }